

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O1

void __thiscall CEditor::CEditor(CEditor *this)

{
  (this->super_IEditor).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IEditor).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CEditor_00215190;
  CUI::CUI(&this->m_UI);
  CLineInput::CLineInput(&this->m_FileDialogFilterInput);
  (this->m_FilePreviewImage).m_Id = -1;
  (this->m_FileList).super_array<CEditor::CFilelistItem,_allocator_default<CEditor::CFilelistItem>_>
  .list = (CFilelistItem *)0x0;
  array<CEditor::CFilelistItem,_allocator_default<CEditor::CFilelistItem>_>::clear
            (&(this->m_FileList).
              super_array<CEditor::CFilelistItem,_allocator_default<CEditor::CFilelistItem>_>);
  (this->m_CheckerTexture).m_Id = -1;
  (this->m_BackgroundTexture).m_Id = -1;
  (this->m_CursorTexture).m_Id = -1;
  (this->m_EntitiesTexture).m_Id = -1;
  (this->m_Brush).m_lLayers.list = (CLayer **)0x0;
  array<CLayer_*,_allocator_default<CLayer_*>_>::clear(&(this->m_Brush).m_lLayers);
  (this->m_Brush).m_aName[0] = '\0';
  (this->m_Brush).m_GameGroup = false;
  (this->m_Brush).m_Visible = true;
  (this->m_Brush).m_SaveToMap = true;
  (this->m_Brush).m_Collapse = false;
  (this->m_Brush).m_OffsetX = 0;
  (this->m_Brush).m_OffsetY = 0;
  (this->m_Brush).m_ParallaxX = 100;
  (this->m_Brush).m_ParallaxY = 100;
  (this->m_Brush).m_UseClipping = 0;
  (this->m_Brush).m_ClipX = 0;
  (this->m_Brush).m_ClipY = 0;
  (this->m_Brush).m_ClipW = 0;
  (this->m_Brush).m_ClipH = 0;
  CLayerTiles::CLayerTiles(&this->m_TilesetPicker,0x10,0x10);
  CLayerQuads::CLayerQuads(&this->m_QuadsetPicker);
  CEditorMap::CEditorMap(&this->m_Map);
  this->m_Mode = 0;
  this->m_Dialog = 0;
  this->m_EditBoxActive = 0;
  this->m_pTooltip = (char *)0x0;
  this->m_GridActive = false;
  this->m_pInput = (IInput *)0x0;
  this->m_pClient = (IClient *)0x0;
  this->m_pGraphics = (IGraphics *)0x0;
  this->m_pTextRender = (ITextRender *)0x0;
  this->m_GridFactor = 1;
  this->m_MouseEdMode = 0;
  this->m_aFileName[0] = '\0';
  this->m_aFileSaveName[0] = '\0';
  this->m_ValidSaveFilename = false;
  this->m_PopupEventActivated = 0;
  this->m_PopupEventWasActivated = 0;
  this->m_FileDialogStorageType = 0;
  this->m_aFileDialogFilterString[0] = '\0';
  CLineInput::SetBuffer(&this->m_FileDialogFilterInput,this->m_aFileDialogFilterString,0x40,0x40);
  this->m_pFileDialogUser = (void *)0x0;
  this->m_aFileDialogFileName[0] = '\0';
  this->m_aFileDialogCurrentFolder[0] = '\0';
  this->m_aFileDialogCurrentLink[0] = '\0';
  this->m_pFileDialogTitle = (char *)0x0;
  this->m_pFileDialogButtonText = (char *)0x0;
  this->m_pFileDialogPath = this->m_aFileDialogCurrentFolder;
  this->m_aFileDialogActivate = false;
  this->m_FileDialogScrollValue = 0.0;
  this->m_FilesSelectedIndex = -1;
  this->m_FilesStartAt = 0;
  this->m_FilesCur = 0;
  this->m_FilesStopAt = 999;
  this->m_WorldOffsetX = 0.0;
  this->m_WorldOffsetY = 0.0;
  this->m_EditorOffsetX = 0.0;
  this->m_EditorOffsetY = 0.0;
  this->m_WorldZoom = 1.0;
  this->m_ZoomLevel = 200;
  this->m_MouseDeltaX = 0.0;
  this->m_MouseDeltaY = 0.0;
  this->m_MouseDeltaWx = 0.0;
  this->m_MouseDeltaWy = 0.0;
  this->m_LockMouse = false;
  this->m_ShowMousePointer = true;
  this->m_GuiActive = true;
  this->m_ProofBorders = false;
  this->m_ShowTileInfo = false;
  this->m_ShowDetail = true;
  this->m_Animate = false;
  this->m_AnimateStart = 0;
  this->m_AnimateTime = 0.0;
  this->m_AnimateSpeed = 1.0;
  this->m_ShowEnvelopeEditor = 0;
  this->m_ShowEnvelopePreview = 0;
  this->m_SelectedQuadEnvelope = -1;
  this->m_SelectedEnvelopePoint = -1;
  (this->m_SelectedColor).field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  (this->m_SelectedColor).field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  (this->m_SelectedColor).field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  (this->m_SelectedColor).field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x0;
  (this->m_InitialPickerColor).field_0 =
       (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)0x3f800000;
  (this->m_InitialPickerColor).field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)0x0;
  *(undefined8 *)&(this->m_InitialPickerColor).field_2 = 0x3f80000000000000;
  (this->m_SelectedPickerColor).field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)0x0;
  (this->m_SelectedPickerColor).field_2 = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)0x0;
  ms_pUiGotContext = (void *)0x0;
  return;
}

Assistant:

CEditor() : m_TilesetPicker(16, 16)
	{
		m_pInput = 0;
		m_pClient = 0;
		m_pGraphics = 0;
		m_pTextRender = 0;

		m_Mode = MODE_LAYERS;
		m_Dialog = 0;
		m_EditBoxActive = 0;
		m_pTooltip = 0;

		m_GridActive = false;
		m_GridFactor = 1;

		m_MouseEdMode = MOUSE_EDIT;

		m_aFileName[0] = 0;
		m_aFileSaveName[0] = 0;
		m_ValidSaveFilename = false;

		m_PopupEventActivated = false;
		m_PopupEventWasActivated = false;

		m_FileDialogStorageType = 0;
		m_aFileDialogFilterString[0] = '\0';
		m_FileDialogFilterInput.SetBuffer(m_aFileDialogFilterString, sizeof(m_aFileDialogFilterString));
		m_pFileDialogTitle = 0;
		m_pFileDialogButtonText = 0;
		m_pFileDialogUser = 0;
		m_aFileDialogFileName[0] = 0;
		m_aFileDialogCurrentFolder[0] = 0;
		m_aFileDialogCurrentLink[0] = 0;
		m_pFileDialogPath = m_aFileDialogCurrentFolder;
		m_aFileDialogActivate = false;
		m_FileDialogScrollValue = 0.0f;
		m_FilesSelectedIndex = -1;
		m_FilesStartAt = 0;
		m_FilesCur = 0;
		m_FilesStopAt = 999;

		m_WorldOffsetX = 0;
		m_WorldOffsetY = 0;
		m_EditorOffsetX = 0.0f;
		m_EditorOffsetY = 0.0f;

		m_WorldZoom = 1.0f;
		m_ZoomLevel = 200;
		m_LockMouse = false;
		m_ShowMousePointer = true;
		m_MouseDeltaX = 0;
		m_MouseDeltaY = 0;
		m_MouseDeltaWx = 0;
		m_MouseDeltaWy = 0;

		m_GuiActive = true;
		m_ProofBorders = false;

		m_ShowTileInfo = false;
		m_ShowDetail = true;
		m_Animate = false;
		m_AnimateStart = 0;
		m_AnimateTime = 0;
		m_AnimateSpeed = 1;

		m_ShowEnvelopeEditor = 0;

		m_ShowEnvelopePreview = SHOWENV_NONE;
		m_SelectedQuadEnvelope = -1;
		m_SelectedEnvelopePoint = -1;

		m_SelectedColor = vec4(0,0,0,0);
		m_InitialPickerColor = vec3(1,0,0);
		m_SelectedPickerColor = vec3(1,0,0);

		ms_pUiGotContext = 0;
	}